

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_witness_stack_clone_alloc
              (wally_tx_witness_stack *stack,wally_tx_witness_stack **output)

{
  int iVar1;
  undefined1 free_parent;
  size_t sVar2;
  long lVar3;
  size_t index;
  wally_tx_witness_stack *result;
  wally_tx_witness_stack *local_30;
  wally_tx_witness_stack **output_00;
  
  iVar1 = -2;
  if ((output != (wally_tx_witness_stack **)0x0) &&
     (*output = (wally_tx_witness_stack *)0x0, stack != (wally_tx_witness_stack *)0x0)) {
    output_00 = &local_30;
    iVar1 = wally_tx_witness_stack_init_alloc(stack->items_allocation_len,output_00);
    free_parent = SUB81(output_00,0);
    if (iVar1 == 0) {
      if (stack->num_items != 0) {
        lVar3 = 8;
        index = 0;
        do {
          sVar2 = index;
          iVar1 = wally_tx_witness_stack_set
                            (local_30,index,*(uchar **)((long)stack->items + lVar3 + -8),
                             *(size_t *)((long)&stack->items->witness + lVar3));
          free_parent = (undefined1)sVar2;
          if (iVar1 != 0) goto LAB_00103a74;
          index = index + 1;
          lVar3 = lVar3 + 0x10;
        } while (index < stack->num_items);
      }
      *output = local_30;
    }
    else {
LAB_00103a74:
      tx_witness_stack_free(local_30,(_Bool)free_parent);
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_witness_stack_clone_alloc(const struct wally_tx_witness_stack *stack,
                                       struct wally_tx_witness_stack **output)
{
    struct wally_tx_witness_stack *result;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;
    if (!stack)
        return WALLY_EINVAL;

    ret = wally_tx_witness_stack_init_alloc(stack->items_allocation_len, &result);
    for (i = 0; ret == WALLY_OK && i < stack->num_items; ++i) {
        ret = wally_tx_witness_stack_set(result, i,
                                         stack->items[i].witness,
                                         stack->items[i].witness_len);
    }
    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_witness_stack_free(result);
    return ret;
}